

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O3

void __thiscall Object::internalProjection(Object *this,Vector2d *obs)

{
  ulong uVar1;
  pointer pEVar2;
  pointer pEVar3;
  long lVar4;
  ulong uVar5;
  Edge *src;
  HeapType heap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  local_70;
  Vector2d *local_50;
  long local_48;
  Edge *local_40;
  EdgeCompFunctor local_38;
  
  local_38.egs = &this->edges;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = obs;
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::priority_queue(&local_70,&local_38,&local_88);
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar3 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar2) {
    do {
      if (pEVar2[(long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start].valid == true) {
        std::
        priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
        ::emplace<unsigned_long&>
                  ((priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
                    *)&local_70,(unsigned_long *)&local_88);
        pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar3 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_88.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
    } while (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start <
             (pointer)(((long)pEVar3 - (long)pEVar2 >> 5) * -0x5555555555555555));
  }
  if (local_70.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_70.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      uVar1 = *local_70.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::
      priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
      ::pop(&local_70);
      pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar3 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pEVar3 != pEVar2) {
        local_48 = uVar1 * 0x60;
        lVar4 = 0;
        uVar5 = 0;
        do {
          if ((uVar1 != uVar5) && ((&pEVar2->valid)[lVar4] != false)) {
            local_40 = (Edge *)((long)&(pEVar2->
                                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       ).
                                       super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       ._M_impl.super__Deque_impl_data._M_map + lVar4);
            src = (Edge *)((long)&(pEVar2->
                                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ).
                                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map + local_48);
            printf("Source : %lu, dst: %lu\n",uVar1,uVar5);
            projectEdge2Edge(this,src,local_50,local_40,&local_70);
            printf("After Source : %lu, dst: %lu\n",uVar1,uVar5);
            pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pEVar3 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x60;
        } while (uVar5 < (ulong)(((long)pEVar3 - (long)pEVar2 >> 5) * -0x5555555555555555));
      }
    } while (local_70.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_70.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_70.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_70.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.c.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.c.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Object::internalProjection(const Eigen::Vector2d& obs) {
    HeapType heap(edges);
    for (size_t i = 0; i < edges.size(); i++) {
        if (edges[i].valid)
            heap.emplace(i);
    }
    while (heap.empty() == false) {
        size_t top = heap.top();
        heap.pop();
        for (size_t i = 0; i < edges.size(); i++) {
            Edge& this_edge = edges[top];
            Edge& eg = edges[i];
            if (eg.valid == false || &eg == &this_edge)
                continue;
            printf("Source : %lu, dst: %lu\n", top, i);
            projectEdge2Edge(this_edge, obs, eg, heap);
            printf("After Source : %lu, dst: %lu\n", top, i);
        }
    }
}